

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall Array::add(Array *this,int item)

{
  element_type *this_00;
  reference pvVar1;
  int item_local;
  Array *this_local;
  
  if (this->totSize < this->theSize + 1) {
    resize(this,(int)((double)this->totSize * 1.5));
  }
  this_00 = std::
            __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  pvVar1 = std::vector<int,_std::allocator<int>_>::at(this_00,(long)this->theSize);
  *pvVar1 = item;
  this->theSize = this->theSize + 1;
  return;
}

Assistant:

void add(int item) {
        if (theSize + 1 > totSize) {
            resize((int) (totSize * 1.5));
        }
        theArray->at(theSize) = (item);
        theSize++;
    }